

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Minisat::IntOption::parse(IntOption *this,char *str)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  undefined1 extraout_AL;
  long lVar4;
  int iVar5;
  char *pcVar6;
  char **ppcVar7;
  bool bVar8;
  char *end;
  char *local_20;
  
  if (*str == '-') {
    pcVar6 = str + (*str == '-');
    pcVar3 = (this->super_Option).name;
    cVar2 = *pcVar3;
    bVar8 = cVar2 == '\0';
    if (bVar8) {
      lVar4 = 0;
LAB_0011119b:
      pcVar6 = pcVar6 + lVar4;
    }
    else if (*pcVar6 == cVar2) {
      lVar4 = 1;
      do {
        cVar2 = pcVar3[lVar4];
        bVar8 = cVar2 == '\0';
        if (bVar8) goto LAB_0011119b;
        pcVar1 = pcVar6 + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pcVar1 == cVar2);
    }
    else {
      bVar8 = false;
    }
    if ((bVar8) && (*pcVar6 == '=')) {
      lVar4 = strtol(pcVar6 + (*pcVar6 == '='),&local_20,10);
      bVar8 = local_20 != (char *)0x0;
      if (!bVar8) {
        return bVar8;
      }
      ppcVar7 = &(this->super_Option).name;
      iVar5 = (int)lVar4;
      if ((this->range).end < iVar5) {
        parse();
      }
      else if ((this->range).begin <= iVar5) {
        this->value = iVar5;
        return bVar8;
      }
      parse();
      operator_delete(ppcVar7,0x30);
      return (bool)extraout_AL;
    }
  }
  return false;
}

Assistant:

Int64Range(int64_t b, int64_t e) : begin(b), end(e) {}